

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O2

void __thiscall
gmlc::concurrency::
DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
setDelayedValue(DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this,string *name,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  iterator __position;
  mapped_type *this_00;
  
  std::mutex::lock(&this->promiseLock);
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::find(&(this->promiseByString)._M_t,name);
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->promiseByString)._M_t._M_impl.super__Rb_tree_header) {
    std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    set_value((promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(__position._M_node + 2),val);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[](&this->usedPromiseByString,name);
    std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(this_00,(promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(__position._M_node + 2));
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::promise<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::promise<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::promise<std::__cxx11::string>>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::promise<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::promise<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::promise<std::__cxx11::string>>>>
                        *)&this->promiseByString,__position);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->promiseLock);
  return;
}

Assistant:

void setDelayedValue(const std::string& name, X&& val)
    {
        std::lock_guard<std::mutex> lock(promiseLock);
        auto fnd = promiseByString.find(name);
        if (fnd != promiseByString.end()) {
            fnd->second.set_value(std::move(val));
            usedPromiseByString[name] = std::move(fnd->second);
            promiseByString.erase(fnd);
        }
    }